

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O0

char * u_rtrim(char *s)

{
  bool bVar1;
  char *local_18;
  char *end;
  char *s_local;
  
  local_18 = strchr(s,0);
  while( true ) {
    bVar1 = false;
    if ((((s < local_18) && (bVar1 = true, local_18[-1] != ' ')) &&
        (bVar1 = true, local_18[-1] != '\t')) && (bVar1 = true, local_18[-1] != '\r')) {
      bVar1 = local_18[-1] == '\n';
    }
    if (!bVar1) break;
    local_18[-1] = '\0';
    local_18 = local_18 + -1;
  }
  return local_18;
}

Assistant:

U_CAPI char * U_EXPORT2
u_rtrim(char *s) {
    char *end=uprv_strchr(s, 0);
    while(s<end && U_IS_INV_WHITESPACE(*(end-1))) {
        *--end = 0;
    }
    return end;
}